

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesr.cc
# Opt level: O1

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
GOESRProduct::getImage(GOESRProduct *this,Handler *config)

{
  pointer pcVar1;
  undefined1 auVar2 [8];
  const_iterator cVar3;
  long in_RDX;
  undefined1 local_50 [8];
  shared_ptr<const_lrit::File> local_48;
  vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  local_38;
  
  (this->files_).
  super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  pcVar1 = (config->type)._M_dataplus._M_p;
  if ((config->type)._M_string_length - (long)pcVar1 == 0x10) {
    local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         *(element_type **)pcVar1;
    local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(pcVar1 + 8);
    if (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        )->_M_use_count =
             (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi)->_M_use_count + 1;
      }
    }
    Image::createFromFile((Image *)local_50,&local_48);
    auVar2 = local_50;
    local_50 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<Image,_std::default_delete<Image>_>::reset
              ((__uniq_ptr_impl<Image,_std::default_delete<Image>_> *)this,(pointer)auVar2);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_50);
    if (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
        != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_48.super___shared_ptr<const_lrit::File,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
  }
  else {
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    vector(&local_38,
           (vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
            *)config);
    Image::createFromFiles((Image *)local_50,&local_38);
    auVar2 = local_50;
    local_50 = (undefined1  [8])0x0;
    std::__uniq_ptr_impl<Image,_std::default_delete<Image>_>::reset
              ((__uniq_ptr_impl<Image,_std::default_delete<Image>_> *)this,(pointer)auVar2);
    std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
              ((unique_ptr<Image,_std::default_delete<Image>_> *)local_50);
    std::
    vector<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>::
    ~vector(&local_38);
  }
  Image::fillSides((Image *)(this->files_).
                            super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cv::Mat>_>_>
                  *)(in_RDX + 0xe0),&config->format);
  if (cVar3._M_node != (_Base_ptr)(in_RDX + 0xe8)) {
    Image::remap((Image *)(this->files_).
                          super__Vector_base<std::shared_ptr<const_lrit::File>,_std::allocator<std::shared_ptr<const_lrit::File>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,(Mat *)(cVar3._M_node + 2));
  }
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Image> GOESRProduct::getImage(const Config::Handler& config) const {
  std::unique_ptr<Image> image;
  if (files_.size() == 1) {
    image = Image::createFromFile(files_[0]);
  } else {
    image = Image::createFromFiles(files_);
  }

  // This turns the white fills outside the disk black
  image->fillSides();

  // Remap image values if configured for this channel
  auto it = config.remap.find(channel_.nameShort);
  if (it != std::end(config.remap)) {
    image->remap(it->second);
  }

  return image;
}